

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_json_uescape_key(void)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  int __fd;
  undefined8 uVar4;
  long lVar5;
  void *__buf;
  void *__buf_00;
  void *__s1;
  void *__s2;
  undefined8 uVar6;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  bson_t b;
  bson_error_t error;
  undefined1 local_380 [4];
  uint local_37c;
  undefined1 local_2b8 [648];
  
  uVar4 = bson_bcon_magic();
  lVar5 = bcon_new(0,anon_var_dwarf_47a2 + 0xc,uVar4,0,"euro",0);
  cVar2 = bson_init_from_json(local_380,"{ \"\\u20AC\": \"euro\"}",0xffffffffffffffff,local_2b8);
  if (cVar2 == '\0') {
    pcVar8 = "r";
    uVar4 = 0x787;
  }
  else {
    __buf = (void *)bson_get_data(local_380);
    __buf_00 = (void *)bson_get_data(lVar5);
    if (*(uint *)(lVar5 + 4) == local_37c) {
      __s1 = (void *)bson_get_data(lVar5);
      __s2 = (void *)bson_get_data(local_380);
      iVar3 = bcmp(__s1,__s2,(ulong)*(uint *)(lVar5 + 4));
      if (iVar3 == 0) {
        bson_destroy(local_380);
        bson_destroy(lVar5);
        return;
      }
    }
    uVar4 = bson_as_canonical_extended_json(local_380,0);
    uVar6 = bson_as_canonical_extended_json(lVar5,0);
    uVar1 = *(uint *)(lVar5 + 4);
    for (uVar9 = 0; (local_37c != (uint)uVar9 && ((uint)uVar9 < uVar1)); uVar9 = uVar9 + 1) {
      if (*(char *)((long)__buf + uVar9) != *(char *)((long)__buf_00 + uVar9)) {
        uVar9 = uVar9 & 0xffffffff;
        goto LAB_001254ba;
      }
    }
    uVar7 = local_37c;
    if (local_37c < uVar1) {
      uVar7 = uVar1;
    }
    uVar9 = (ulong)(uVar7 - 1);
LAB_001254ba:
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar9,uVar4,uVar6);
    iVar3 = open("failure.bad.bson",0x42,0x1a0);
    __fd = open("failure.expected.bson",0x42,0x1a0);
    if (iVar3 == -1) {
      pcVar8 = "fd1 != -1";
    }
    else if (__fd == -1) {
      pcVar8 = "fd2 != -1";
    }
    else {
      uVar9 = write(iVar3,__buf,(ulong)local_37c);
      if (uVar9 == local_37c) {
        uVar1 = *(uint *)(lVar5 + 4);
        uVar9 = write(__fd,__buf_00,(ulong)uVar1);
        if (uVar9 == uVar1) {
          close(iVar3);
          close(__fd);
          pcVar8 = "0";
        }
        else {
          pcVar8 = "(bson_euro)->len == bson_write (fd2, expected_data, (bson_euro)->len)";
        }
      }
      else {
        pcVar8 = "(&b)->len == bson_write (fd1, bson_data, (&b)->len)";
      }
    }
    uVar4 = 0x788;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar4,"test_bson_json_uescape_key",pcVar8);
  abort();
}

Assistant:

static void
test_bson_json_uescape_key (void)
{
   bson_error_t error;
   bson_t b;
   bool r;

   bson_t *bson_euro = BCON_NEW ("\xE2\x82\xAC", BCON_UTF8 ("euro"));

   r = bson_init_from_json (&b, "{ \"\\u20AC\": \"euro\"}", -1, &error);
   BSON_ASSERT (r);
   bson_eq_bson (&b, bson_euro);

   bson_destroy (&b);
   bson_destroy (bson_euro);
}